

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  UBool UVar3;
  int n;
  CallFlags e;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  LPCSTR pCVar6;
  Recycler *pRVar7;
  JavascriptString *pJVar8;
  charcount_t local_1f4;
  code *pcStack_1f0;
  charcount_t defaultLangtag16Actual;
  undefined8 local_1e8;
  TrackAllocData local_1e0;
  char16_t *local_1b8;
  char16 *defaultLangtag16;
  int langtagActual;
  int localeIDActual;
  char defaultLocaleID [157];
  char defaultLangtag [157];
  UErrorCode local_5c;
  ScriptContext *pSStack_58;
  UErrorCode status;
  ScriptContext *scriptContext;
  CallInfo CStack_48;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  CStack_48 = callInfo;
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  scriptContext._4_4_ = local_40._0_4_ & 0xffffff;
  pSStack_58 = RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x576,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  local_5c = U_ZERO_ERROR;
  memset(defaultLocaleID + 0x98,0,0x9d);
  memset(&langtagActual,0,0x9d);
  defaultLangtag16._4_4_ = uloc_getName_70(0,&langtagActual,0x9d,&local_5c);
  if (local_5c == U_MEMORY_ALLOCATION_ERROR) {
    Throw::OutOfMemory();
  }
  UVar3 = U_FAILURE(local_5c);
  if ((UVar3 == '\0') && (local_5c != U_STRING_NOT_TERMINATED_WARNING)) {
    if ((((int)defaultLangtag16._4_4_ < 1) || (0x9c < defaultLangtag16._4_4_)) &&
       (((int)defaultLangtag16._4_4_ < 1 || (0x9c < defaultLangtag16._4_4_)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x588,
                                  "(localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0))"
                                  ,
                                  "localeIDActual > 0 && localeIDActual < (sizeof(*__countof_helper(defaultLocaleID)) + 0)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    pCVar6 = (LPCSTR)u_errorName_70(local_5c);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x588,"(false)",pCVar6);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  defaultLangtag16._0_4_ =
       uloc_toLanguageTag_70(&langtagActual,defaultLocaleID + 0x98,0x9d,1,&local_5c);
  if (local_5c != U_MEMORY_ALLOCATION_ERROR) {
    UVar3 = U_FAILURE(local_5c);
    if ((UVar3 == '\0') && (local_5c != U_STRING_NOT_TERMINATED_WARNING)) {
      if ((((int)(uint)defaultLangtag16 < 1) || (0x9c < (uint)defaultLangtag16)) &&
         (((int)(uint)defaultLangtag16 < 1 || (0x9c < (uint)defaultLangtag16)))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x58b,
                                    "(langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0))"
                                    ,
                                    "langtagActual > 0 && langtagActual < (sizeof(*__countof_helper(defaultLangtag)) + 0)"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      pCVar6 = (LPCSTR)u_errorName_70(local_5c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x58b,"(false)",pCVar6);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pRVar7 = ScriptContext::GetRecycler(pSStack_58);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_1e0,(type_info *)&char16_t::typeinfo,0,(long)(int)((uint)defaultLangtag16 + 1)
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
               ,0x58d);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_1e0);
    pcStack_1f0 = Memory::Recycler::AllocLeaf;
    local_1e8 = 0;
    local_1b8 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                          ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocLeaf,0,
                           (long)(int)((uint)defaultLangtag16 + 1));
    local_1f4 = 0;
    utf8::NarrowStringToWideNoAlloc
              (defaultLocaleID + 0x98,(long)(int)(uint)defaultLangtag16,local_1b8,
               (long)(int)((uint)defaultLangtag16 + 1),&local_1f4);
    if ((ulong)local_1f4 != (long)(int)(uint)defaultLangtag16) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x590,
                                  "(defaultLangtag16Actual == static_cast<size_t>(langtagActual))",
                                  "Language tags should always be ASCII");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pJVar8 = JavascriptString::NewWithBuffer(local_1b8,local_1f4,pSStack_58);
    return pJVar8;
  }
  Throw::OutOfMemory();
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetDefaultLocale(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#ifdef INTL_WINGLOB
        char16 defaultLocale[LOCALE_NAME_MAX_LENGTH];
        defaultLocale[0] = '\0';

        if (GetUserDefaultLocaleName(defaultLocale, _countof(defaultLocale)) == 0)
        {
            JavascriptError::MapAndThrowError(scriptContext, HRESULT_FROM_WIN32(GetLastError()));
        }

        return JavascriptString::NewCopySz(defaultLocale, scriptContext);
#else
        UErrorCode status = U_ZERO_ERROR;
        char defaultLangtag[ULOC_FULLNAME_CAPACITY] = { 0 };
        char defaultLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };

        int localeIDActual = uloc_getName(nullptr, defaultLocaleID, _countof(defaultLocaleID), &status);
        ICU_ASSERT(status, localeIDActual > 0 && localeIDActual < _countof(defaultLocaleID));

        int langtagActual = uloc_toLanguageTag(defaultLocaleID, defaultLangtag, _countof(defaultLangtag), true, &status);
        ICU_ASSERT(status, langtagActual > 0 && langtagActual < _countof(defaultLangtag));

        char16 *defaultLangtag16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, langtagActual + 1);
        charcount_t defaultLangtag16Actual = 0;
        utf8::NarrowStringToWideNoAlloc(defaultLangtag, static_cast<size_t>(langtagActual), defaultLangtag16, langtagActual + 1, &defaultLangtag16Actual);
        AssertOrFailFastMsg(defaultLangtag16Actual == static_cast<size_t>(langtagActual), "Language tags should always be ASCII");
        return JavascriptString::NewWithBuffer(defaultLangtag16, defaultLangtag16Actual, scriptContext);
#endif
    }